

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# additional.cpp
# Opt level: O0

BN * CTO(BN *__return_storage_ptr__,vector<BN,_std::allocator<BN>_> *m,
        vector<BN,_std::allocator<BN>_> *v)

{
  size_type sVar1;
  size_type sVar2;
  invalid_argument *this;
  const_reference pvVar3;
  const_reference bn;
  BN local_148;
  BN local_130;
  BN local_118;
  BN local_100;
  BN local_e8;
  BN local_d0;
  BN local_b8;
  undefined1 local_a0 [8];
  BN Mi;
  undefined1 local_80 [4];
  int i_1;
  BN x;
  int local_4c;
  undefined1 local_48 [4];
  int i;
  BN M;
  int t;
  vector<BN,_std::allocator<BN>_> *v_local;
  vector<BN,_std::allocator<BN>_> *m_local;
  
  sVar1 = std::vector<BN,_std::allocator<BN>_>::size(m);
  sVar2 = std::vector<BN,_std::allocator<BN>_>::size(v);
  if (sVar1 != sVar2) {
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"CTO: Sizes of arrays are different");
    __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  sVar1 = std::vector<BN,_std::allocator<BN>_>::size(m);
  M.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = (int)sVar1;
  pvVar3 = std::vector<BN,_std::allocator<BN>_>::operator[](m,0);
  BN::BN((BN *)local_48,pvVar3);
  for (local_4c = 1;
      local_4c <
      (int)M.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage; local_4c = local_4c + 1) {
    pvVar3 = std::vector<BN,_std::allocator<BN>_>::operator[](m,(long)local_4c);
    BN::operator*((BN *)&x.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,(BN *)local_48,pvVar3);
    BN::operator=((BN *)local_48,
                  (BN *)&x.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
    BN::~BN((BN *)&x.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
  }
  BN::bn0();
  for (Mi.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      Mi.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ <
      (int)M.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      Mi.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           Mi.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
    pvVar3 = std::vector<BN,_std::allocator<BN>_>::operator[]
                       (m,(long)Mi.ba.
                                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    BN::operator/((BN *)local_a0,(BN *)local_48,pvVar3);
    pvVar3 = std::vector<BN,_std::allocator<BN>_>::operator[]
                       (v,(long)Mi.ba.
                                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    bn = std::vector<BN,_std::allocator<BN>_>::operator[]
                   (m,(long)Mi.ba.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    BN::operator/(&local_100,(BN *)local_48,bn);
    BN::operator*(&local_e8,pvVar3,&local_100);
    pvVar3 = std::vector<BN,_std::allocator<BN>_>::operator[]
                       (m,(long)Mi.ba.
                                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    BN::operator/(&local_130,(BN *)local_48,pvVar3);
    pvVar3 = std::vector<BN,_std::allocator<BN>_>::operator[]
                       (m,(long)Mi.ba.
                                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    BN::BN(&local_148,pvVar3);
    gcdInverseEuclideanBinary(&local_118,&local_130,&local_148);
    BN::operator*(&local_d0,&local_e8,&local_118);
    BN::operator%(&local_b8,&local_d0,(BN *)local_48);
    BN::operator+=((BN *)local_80,&local_b8);
    BN::~BN(&local_b8);
    BN::~BN(&local_d0);
    BN::~BN(&local_118);
    BN::~BN(&local_148);
    BN::~BN(&local_130);
    BN::~BN(&local_e8);
    BN::~BN(&local_100);
    BN::~BN((BN *)local_a0);
  }
  BN::operator%(__return_storage_ptr__,(BN *)local_80,(BN *)local_48);
  BN::~BN((BN *)local_80);
  BN::~BN((BN *)local_48);
  return __return_storage_ptr__;
}

Assistant:

BN CTO(const std::vector <BN>& m, const std::vector <BN>& v)
{
    if(m.size()!=v.size())
        throw invalid_argument("CTO: Sizes of arrays are different");

    int t = m.size();
    BN M = m[0];
    for (int i=1;i<t;i++)
        M = M * m[i];
    BN x(BN::bn0());
    for (int i=0;i<t;i++)
    {
        BN Mi = M/m[i];
        x += v[i] * (M/m[i]) * gcdInverseEuclideanBinary(M/m[i],m[i]) % M;
    }
    return x % M;
}